

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int VP8LBitWriterResize(VP8LBitWriter *bw,size_t extra_size)

{
  ulong uVar1;
  uint64_t nmemb;
  ulong size;
  void *__dest;
  long in_RSI;
  long in_RDI;
  size_t size_required;
  uint64_t size_required_64b;
  size_t current_size;
  size_t max_bytes;
  size_t allocated_size;
  uint8_t *allocated_buf;
  undefined8 local_28;
  undefined4 local_4;
  
  uVar1 = *(long *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x10);
  nmemb = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10);
  size = nmemb + in_RSI;
  if ((uVar1 == 0) || (uVar1 < size)) {
    local_28 = uVar1 * 3 >> 1;
    if (local_28 < size) {
      local_28 = size;
    }
    __dest = WebPSafeMalloc(nmemb,size);
    if (__dest == (void *)0x0) {
      *(undefined4 *)(in_RDI + 0x28) = 1;
      local_4 = 0;
    }
    else {
      if (nmemb != 0) {
        memcpy(__dest,*(void **)(in_RDI + 0x10),nmemb);
      }
      WebPSafeFree((void *)0x1b6b56);
      *(void **)(in_RDI + 0x10) = __dest;
      *(uint64_t *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + nmemb;
      *(ulong *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x10) + ((local_28 >> 10) + 1) * 0x400;
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int VP8LBitWriterResize(VP8LBitWriter* const bw, size_t extra_size) {
  uint8_t* allocated_buf;
  size_t allocated_size;
  const size_t max_bytes = bw->end_ - bw->buf_;
  const size_t current_size = bw->cur_ - bw->buf_;
  const uint64_t size_required_64b = (uint64_t)current_size + extra_size;
  const size_t size_required = (size_t)size_required_64b;
  if (size_required != size_required_64b) {
    bw->error_ = 1;
    return 0;
  }
  if (max_bytes > 0 && size_required <= max_bytes) return 1;
  allocated_size = (3 * max_bytes) >> 1;
  if (allocated_size < size_required) allocated_size = size_required;
  // make allocated size multiple of 1k
  allocated_size = (((allocated_size >> 10) + 1) << 10);
  allocated_buf = (uint8_t*)WebPSafeMalloc(1ULL, allocated_size);
  if (allocated_buf == NULL) {
    bw->error_ = 1;
    return 0;
  }
  if (current_size > 0) {
    memcpy(allocated_buf, bw->buf_, current_size);
  }
  WebPSafeFree(bw->buf_);
  bw->buf_ = allocated_buf;
  bw->cur_ = bw->buf_ + current_size;
  bw->end_ = bw->buf_ + allocated_size;
  return 1;
}